

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_named_type.cpp
# Opt level: O0

int main(int param_1,char **argv)

{
  char *pcVar1;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  char **local_18;
  char **argv_local;
  int param_0_local;
  
  pcVar1 = *argv;
  local_18 = argv;
  argv_local._4_4_ = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar1,&local_79);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "gdb -batch -ex \'file ");
  std::operator+(local_38,(char *)local_58);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  system(pcVar1);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return 0;
}

Assistant:

int main(int, char** argv) {
  std::system(("gdb -batch -ex 'file " + std::string{argv[0]} + "' -ex 'disassemble test'").c_str());
}